

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

void Eigen::internal::throw_std_bad_alloc(void)

{
  undefined8 uVar1;
  bad_alloc *unaff_retaddr;
  
  uVar1 = __cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc(unaff_retaddr);
  __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

inline void throw_std_bad_alloc()
{
  #ifdef EIGEN_EXCEPTIONS
    throw std::bad_alloc();
  #else
    std::size_t huge = -1;
    new int[huge];
  #endif
}